

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O3

void __thiscall chrono::fea::ChLinkPointTriface::ChLinkPointTriface(ChLinkPointTriface *this)

{
  double dVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [56];
  undefined1 auVar4 [64];
  
  ChObj::ChObj((ChObj *)this);
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   ((long)&(this->super_ChLinkBase).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = auVar2;
  (this->super_ChLinkBase).super_ChPhysicsItem.system = (ChSystem *)auVar2._0_8_;
  (this->super_ChLinkBase).super_ChPhysicsItem.vis_model_instance =
       (shared_ptr<chrono::ChVisualModelInstance>)auVar2._8_16_;
  (this->super_ChLinkBase).super_ChPhysicsItem.cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar2._24_8_;
  *(undefined2 *)&(this->super_ChLinkBase).super_ChPhysicsItem.field_0x74 = 0x100;
  (this->super_ChLinkBase).super_ChPhysicsItem.field_0x76 = 0;
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkPointTriface_00b28da8;
  dVar1 = DAT_00b689a0;
  (this->react).m_data[0] = VNULL;
  (this->react).m_data[1] = dVar1;
  (this->react).m_data[2] = DAT_00b689a8;
  auVar4 = ZEXT864(0) << 0x20;
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->constraint1).super_ChConstraint.c_i = (double)auVar2._0_8_;
  (this->constraint1).super_ChConstraint.l_i = (double)auVar2._8_8_;
  (this->constraint1).super_ChConstraint.b_i = (double)auVar2._16_8_;
  (this->constraint1).super_ChConstraint.cfm_i = (double)auVar2._24_8_;
  (this->constraint1).super_ChConstraint.valid = false;
  (this->constraint1).super_ChConstraint.disabled = false;
  (this->constraint1).super_ChConstraint.redundant = false;
  (this->constraint1).super_ChConstraint.broken = false;
  (this->constraint1).super_ChConstraint.active = true;
  (this->constraint1).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint1).super_ChConstraint.g_i = 0.0;
  (this->constraint1).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoTuples_00b29380;
  (this->constraint1).tuple_b.variables_2 = (ChVariables *)auVar4._0_8_;
  (this->constraint1).tuple_b.variables_3 = (ChVariables *)auVar4._8_8_;
  (this->constraint1).tuple_b.Cq_1 =
       (ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars1>)auVar4._16_24_;
  (this->constraint1).tuple_b.Cq_2 =
       (ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars2>)auVar4._40_24_;
  auVar3 = auVar4._0_56_;
  (this->constraint1).tuple_a.variables = (ChVariables *)auVar3._0_8_;
  (this->constraint1).tuple_a.Cq =
       (ChRowVectorN<double,_ChVariableTupleCarrier_1vars<3>::nvars1>)auVar3._8_24_;
  (this->constraint1).tuple_a.Eq =
       (ChVectorN<double,_ChVariableTupleCarrier_1vars<3>::nvars1>)auVar3._32_24_;
  (this->constraint1).tuple_b.variables_1 = (ChVariables *)auVar4._56_8_;
  *(undefined1 (*) [64])
   ((long)(this->constraint1).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       auVar4;
  (this->constraint2).super_ChConstraint.c_i = (double)auVar2._0_8_;
  (this->constraint2).super_ChConstraint.l_i = (double)auVar2._8_8_;
  (this->constraint2).super_ChConstraint.b_i = (double)auVar2._16_8_;
  (this->constraint2).super_ChConstraint.cfm_i = (double)auVar2._24_8_;
  (this->constraint2).super_ChConstraint.valid = false;
  (this->constraint2).super_ChConstraint.disabled = false;
  (this->constraint2).super_ChConstraint.redundant = false;
  (this->constraint2).super_ChConstraint.broken = false;
  (this->constraint2).super_ChConstraint.active = true;
  (this->constraint2).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint2).super_ChConstraint.g_i = 0.0;
  (this->constraint2).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoTuples_00b29380;
  (this->constraint2).tuple_b.variables_2 = (ChVariables *)auVar4._0_8_;
  (this->constraint2).tuple_b.variables_3 = (ChVariables *)auVar4._8_8_;
  (this->constraint2).tuple_b.Cq_1 =
       (ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars1>)auVar4._16_24_;
  (this->constraint2).tuple_b.Cq_2 =
       (ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars2>)auVar4._40_24_;
  auVar3 = auVar4._0_56_;
  (this->constraint2).tuple_a.variables = (ChVariables *)auVar3._0_8_;
  (this->constraint2).tuple_a.Cq =
       (ChRowVectorN<double,_ChVariableTupleCarrier_1vars<3>::nvars1>)auVar3._8_24_;
  (this->constraint2).tuple_a.Eq =
       (ChVectorN<double,_ChVariableTupleCarrier_1vars<3>::nvars1>)auVar3._32_24_;
  (this->constraint2).tuple_b.variables_1 = (ChVariables *)auVar4._56_8_;
  *(undefined1 (*) [64])
   ((long)(this->constraint2).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       auVar4;
  (this->constraint3).super_ChConstraint.c_i = (double)auVar2._0_8_;
  (this->constraint3).super_ChConstraint.l_i = (double)auVar2._8_8_;
  (this->constraint3).super_ChConstraint.b_i = (double)auVar2._16_8_;
  (this->constraint3).super_ChConstraint.cfm_i = (double)auVar2._24_8_;
  (this->constraint3).super_ChConstraint.valid = false;
  (this->constraint3).super_ChConstraint.disabled = false;
  (this->constraint3).super_ChConstraint.redundant = false;
  (this->constraint3).super_ChConstraint.broken = false;
  (this->constraint3).super_ChConstraint.active = true;
  (this->constraint3).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint3).super_ChConstraint.g_i = 0.0;
  (this->constraint3).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoTuples_00b29380;
  *(undefined1 (*) [64])
   ((long)(this->constraint3).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       auVar4;
  (this->constraint3).tuple_b.variables_2 = (ChVariables *)auVar4._0_8_;
  (this->constraint3).tuple_b.variables_3 = (ChVariables *)auVar4._8_8_;
  (this->constraint3).tuple_b.Cq_1 =
       (ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars1>)auVar4._16_24_;
  (this->constraint3).tuple_b.Cq_2 =
       (ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars2>)auVar4._40_24_;
  auVar3 = auVar4._0_56_;
  (this->constraint3).tuple_a.variables = (ChVariables *)auVar3._0_8_;
  (this->constraint3).tuple_a.Cq =
       (ChRowVectorN<double,_ChVariableTupleCarrier_1vars<3>::nvars1>)auVar3._8_24_;
  (this->constraint3).tuple_a.Eq =
       (ChVectorN<double,_ChVariableTupleCarrier_1vars<3>::nvars1>)auVar3._32_24_;
  (this->constraint3).tuple_b.variables_1 = (ChVariables *)auVar4._56_8_;
  (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)(ZEXT416(0) << 0x40);
  (this->mtriangle).super_ChVariableTupleCarrier_3vars<3,_3,_3>._vptr_ChVariableTupleCarrier_3vars =
       (_func_int **)&PTR__ChTriangleOfXYZnodes_00b29288;
  *(undefined1 (*) [64])&(this->mtriangle).mnodeB1 = auVar4;
  this->d = 0.0;
  return;
}

Assistant:

ChLinkPointTriface::ChLinkPointTriface() : react(VNULL), s2(0), s3(0), d(0) {}